

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_xswiftec_inv_var(secp256k1_fe *t,secp256k1_fe *x_in,secp256k1_fe *u_in,int c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  int iVar728;
  ulong uVar729;
  ulong uVar730;
  long lVar731;
  ulong uVar732;
  ulong uVar733;
  ulong uVar734;
  ulong uVar735;
  ulong uVar736;
  ulong uVar737;
  ulong uVar738;
  long lVar739;
  ulong uVar740;
  long lVar741;
  ulong uVar742;
  ulong uVar743;
  ulong uVar744;
  ulong uVar745;
  ulong uVar746;
  ulong uVar747;
  ulong uVar748;
  ulong uVar749;
  ulong uVar750;
  ulong uVar751;
  ulong uVar752;
  ulong uVar753;
  long lVar754;
  uint64_t a4;
  ulong uVar755;
  ulong uVar756;
  bool bVar757;
  secp256k1_fe local_118;
  secp256k1_fe local_f0;
  secp256k1_fe s;
  secp256k1_fe r;
  secp256k1_fe q;
  
  uVar744 = (x_in->n[4] >> 0x30) * 0x1000003d1 + x_in->n[0];
  uVar752 = (uVar744 >> 0x34) + x_in->n[1];
  uVar749 = (uVar752 >> 0x34) + x_in->n[2];
  uVar732 = (uVar749 >> 0x34) + x_in->n[3];
  uVar736 = (u_in->n[4] >> 0x30) * 0x1000003d1 + u_in->n[0];
  uVar742 = (uVar736 >> 0x34) + u_in->n[1];
  uVar740 = (uVar742 >> 0x34) + u_in->n[2];
  uVar734 = (uVar740 >> 0x34) + u_in->n[3];
  uVar745 = (uVar732 >> 0x34) + (x_in->n[4] & 0xffffffffffff);
  uVar746 = (uVar734 >> 0x34) + (u_in->n[4] & 0xffffffffffff);
  uVar744 = uVar744 & 0xfffffffffffff;
  uVar752 = uVar752 & 0xfffffffffffff;
  uVar749 = uVar749 & 0xfffffffffffff;
  uVar732 = uVar732 & 0xfffffffffffff;
  uVar736 = uVar736 & 0xfffffffffffff;
  uVar742 = uVar742 & 0xfffffffffffff;
  uVar740 = uVar740 & 0xfffffffffffff;
  uVar734 = uVar734 & 0xfffffffffffff;
  if ((c & 2U) == 0) {
    uVar750 = 0x5ffff9ffffe91a - (uVar736 + uVar744);
    uVar753 = 0x5ffffffffffffa - (uVar752 + uVar742);
    uVar747 = 0x5ffffffffffffa - (uVar749 + uVar740);
    uVar733 = 0x5ffffffffffffa - (uVar734 + uVar732);
    uVar755 = 0x5fffffffffffa - (uVar745 + uVar746);
    local_118.n[0] = uVar750;
    local_118.n[1] = uVar753;
    local_118.n[2] = uVar747;
    local_118.n[3] = uVar733;
    local_118.n[4] = uVar755;
    iVar728 = secp256k1_ge_x_on_curve_var(&local_118);
    if (iVar728 != 0) {
      return 0;
    }
    uVar743 = uVar750 * 2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar733;
    auVar374._8_8_ = 0;
    auVar374._0_8_ = uVar743;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar747;
    auVar375._8_8_ = 0;
    auVar375._0_8_ = uVar753 * 2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar755;
    auVar376._8_8_ = 0;
    auVar376._0_8_ = uVar755;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = SUB168(auVar3 * auVar376,0);
    auVar167 = auVar2 * auVar375 + auVar1 * auVar374 + auVar4 * ZEXT816(0x1000003d10);
    uVar729 = auVar167._0_8_;
    auVar675._8_8_ = 0;
    auVar675._0_8_ = auVar167._8_8_ << 0xc | uVar729 >> 0x34;
    uVar755 = uVar755 * 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar755;
    auVar377._8_8_ = 0;
    auVar377._0_8_ = uVar750;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar733;
    auVar378._8_8_ = 0;
    auVar378._0_8_ = uVar753 * 2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar747;
    auVar379._8_8_ = 0;
    auVar379._0_8_ = uVar747;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = SUB168(auVar3 * auVar376,8);
    auVar675 = auVar8 * ZEXT816(0x1000003d10000) +
               auVar7 * auVar379 + auVar6 * auVar378 + auVar5 * auVar377 + auVar675;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar750;
    auVar380._8_8_ = 0;
    auVar380._0_8_ = uVar750;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar755;
    auVar381._8_8_ = 0;
    auVar381._0_8_ = uVar753;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar733;
    auVar382._8_8_ = 0;
    auVar382._0_8_ = uVar747 * 2;
    auVar167 = auVar11 * auVar382 + auVar10 * auVar381 + (auVar675 >> 0x34);
    uVar750 = auVar167._0_8_;
    auVar676._8_8_ = 0;
    auVar676._0_8_ = auVar167._8_8_ << 0xc | uVar750 >> 0x34;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (uVar750 & 0xfffffffffffff) << 4 | (ulong)(auVar675._6_2_ & 0xf);
    auVar167 = auVar12 * ZEXT816(0x1000003d1) + auVar9 * auVar380;
    uVar737 = auVar167._0_8_;
    auVar677._8_8_ = 0;
    auVar677._0_8_ = auVar167._8_8_ << 0xc | uVar737 >> 0x34;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar753;
    auVar383._8_8_ = 0;
    auVar383._0_8_ = uVar743;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar755;
    auVar384._8_8_ = 0;
    auVar384._0_8_ = uVar747;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar733;
    auVar385._8_8_ = 0;
    auVar385._0_8_ = uVar733;
    auVar676 = auVar15 * auVar385 + auVar14 * auVar384 + auVar676;
    uVar750 = auVar676._0_8_;
    auVar678._8_8_ = 0;
    auVar678._0_8_ = auVar676._8_8_ << 0xc | uVar750 >> 0x34;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar750 & 0xfffffffffffff;
    auVar677 = auVar16 * ZEXT816(0x1000003d10) + auVar13 * auVar383 + auVar677;
    uVar750 = auVar677._0_8_;
    auVar679._8_8_ = 0;
    auVar679._0_8_ = auVar677._8_8_ << 0xc | uVar750 >> 0x34;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar747;
    auVar386._8_8_ = 0;
    auVar386._0_8_ = uVar743;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar753;
    auVar387._8_8_ = 0;
    auVar387._0_8_ = uVar753;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar755;
    auVar388._8_8_ = 0;
    auVar388._0_8_ = uVar733;
    auVar678 = auVar19 * auVar388 + auVar678;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = auVar678._0_8_;
    auVar679 = auVar20 * ZEXT816(0x1000003d10) + auVar18 * auVar387 + auVar17 * auVar386 + auVar679;
    auVar167 = auVar679 >> 0x34;
    auVar681._8_8_ = 0;
    auVar681._0_8_ = auVar167._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar678._8_8_;
    auVar680._8_8_ = auVar167._8_8_;
    auVar680._0_8_ = uVar729 & 0xffffffffffffe;
    auVar681 = auVar21 * ZEXT816(0x1000003d10000) + auVar680 + auVar681;
    uVar747 = auVar681._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar732;
    auVar389._8_8_ = 0;
    auVar389._0_8_ = uVar736;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar742;
    auVar390._8_8_ = 0;
    auVar390._0_8_ = uVar749;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar740;
    auVar391._8_8_ = 0;
    auVar391._0_8_ = uVar752;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar734;
    auVar392._8_8_ = 0;
    auVar392._0_8_ = uVar744;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar746;
    auVar393._8_8_ = 0;
    auVar393._0_8_ = uVar745;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = SUB168(auVar26 * auVar393,0);
    auVar169 = auVar23 * auVar390 + auVar22 * auVar389 + auVar24 * auVar391 + auVar25 * auVar392 +
               auVar27 * ZEXT816(0x1000003d10);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar745;
    auVar394._8_8_ = 0;
    auVar394._0_8_ = uVar736;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar742;
    auVar395._8_8_ = 0;
    auVar395._0_8_ = uVar732;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar740;
    auVar396._8_8_ = 0;
    auVar396._0_8_ = uVar749;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar734;
    auVar397._8_8_ = 0;
    auVar397._0_8_ = uVar752;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar746;
    auVar398._8_8_ = 0;
    auVar398._0_8_ = uVar744;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = SUB168(auVar26 * auVar393,8);
    auVar167 = auVar33 * ZEXT816(0x1000003d10000) +
               auVar29 * auVar395 + auVar28 * auVar394 + auVar30 * auVar396 + auVar31 * auVar397 +
               auVar32 * auVar398 + (auVar169 >> 0x34);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar736;
    auVar399._8_8_ = 0;
    auVar399._0_8_ = uVar744;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar745;
    auVar400._8_8_ = 0;
    auVar400._0_8_ = uVar742;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar740;
    auVar401._8_8_ = 0;
    auVar401._0_8_ = uVar732;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar734;
    auVar402._8_8_ = 0;
    auVar402._0_8_ = uVar749;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar746;
    auVar403._8_8_ = 0;
    auVar403._0_8_ = uVar752;
    auVar168 = auVar38 * auVar403 + auVar37 * auVar402 + auVar36 * auVar401 + auVar35 * auVar400 +
               (auVar167 >> 0x34);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
    auVar170 = auVar34 * auVar399 + auVar39 * ZEXT816(0x1000003d1);
    uVar755 = auVar170._0_8_;
    auVar682._8_8_ = 0;
    auVar682._0_8_ = auVar170._8_8_ * 0x1000 | uVar755 >> 0x34;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar736;
    auVar404._8_8_ = 0;
    auVar404._0_8_ = uVar752;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar742;
    auVar405._8_8_ = 0;
    auVar405._0_8_ = uVar744;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar740;
    auVar406._8_8_ = 0;
    auVar406._0_8_ = uVar745;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar734;
    auVar407._8_8_ = 0;
    auVar407._0_8_ = uVar732;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar746;
    auVar408._8_8_ = 0;
    auVar408._0_8_ = uVar749;
    auVar168 = auVar44 * auVar408 + auVar43 * auVar407 + auVar42 * auVar406 + (auVar168 >> 0x34);
    uVar733 = auVar168._0_8_;
    auVar683._8_8_ = 0;
    auVar683._0_8_ = auVar168._8_8_ << 0xc | uVar733 >> 0x34;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar733 & 0xfffffffffffff;
    auVar682 = auVar45 * ZEXT816(0x1000003d10) + auVar40 * auVar404 + auVar41 * auVar405 + auVar682;
    uVar753 = auVar682._0_8_;
    auVar684._8_8_ = 0;
    auVar684._0_8_ = auVar682._8_8_ << 0xc | uVar753 >> 0x34;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar736;
    auVar409._8_8_ = 0;
    auVar409._0_8_ = uVar749;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar742;
    auVar410._8_8_ = 0;
    auVar410._0_8_ = uVar752;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar740;
    auVar411._8_8_ = 0;
    auVar411._0_8_ = uVar744;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar734;
    auVar412._8_8_ = 0;
    auVar412._0_8_ = uVar745;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar746;
    auVar413._8_8_ = 0;
    auVar413._0_8_ = uVar732;
    auVar683 = auVar50 * auVar413 + auVar49 * auVar412 + auVar683;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auVar683._0_8_;
    auVar684 = auVar51 * ZEXT816(0x1000003d10) +
               auVar48 * auVar411 + auVar47 * auVar410 + auVar46 * auVar409 + auVar684;
    auVar168 = auVar684 >> 0x34;
    auVar686._8_8_ = 0;
    auVar686._0_8_ = auVar168._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auVar683._8_8_;
    auVar685._8_8_ = auVar168._8_8_;
    auVar685._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
    auVar686 = auVar52 * ZEXT816(0x1000003d10000) + auVar685 + auVar686;
    uVar733 = auVar686._0_8_;
    s.n[3] = (uVar733 & 0xfffffffffffff) + (0x3ffffffffffffc - (uVar747 & 0xfffffffffffff));
    s.n[4] = (auVar686._8_8_ << 0xc | uVar733 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff) +
             (0x3fffffffffffc -
             ((auVar681._8_8_ << 0xc | uVar747 >> 0x34) + (auVar675._0_8_ & 0xffffffffffff)));
    s.n[0] = (uVar755 & 0xfffffffffffff) + (0x3ffffbfffff0bc - (uVar737 & 0xfffffffffffff));
    s.n[1] = (uVar753 & 0xfffffffffffff) + (0x3ffffffffffffc - (uVar750 & 0xfffffffffffff));
    uVar755 = uVar736 * 2;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar734;
    auVar414._8_8_ = 0;
    auVar414._0_8_ = uVar755;
    s.n[2] = (auVar684._0_8_ & 0xfffffffffffff) +
             (0x3ffffffffffffc - (auVar679._0_8_ & 0xfffffffffffff));
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar740;
    auVar415._8_8_ = 0;
    auVar415._0_8_ = uVar742 * 2;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar746;
    auVar416._8_8_ = 0;
    auVar416._0_8_ = uVar746;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = SUB168(auVar55 * auVar416,0);
    auVar167 = auVar56 * ZEXT816(0x1000003d10) + auVar54 * auVar415 + auVar53 * auVar414;
    uVar747 = auVar167._0_8_;
    auVar687._8_8_ = 0;
    auVar687._0_8_ = auVar167._8_8_ << 0xc | uVar747 >> 0x34;
    uVar733 = uVar746 * 2;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar733;
    auVar417._8_8_ = 0;
    auVar417._0_8_ = uVar736;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar734;
    auVar418._8_8_ = 0;
    auVar418._0_8_ = uVar742 * 2;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar740;
    auVar419._8_8_ = 0;
    auVar419._0_8_ = uVar740;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = SUB168(auVar55 * auVar416,8);
    auVar687 = auVar60 * ZEXT816(0x1000003d10000) +
               auVar57 * auVar417 + auVar59 * auVar419 + auVar58 * auVar418 + auVar687;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar736;
    auVar420._8_8_ = 0;
    auVar420._0_8_ = uVar736;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar733;
    auVar421._8_8_ = 0;
    auVar421._0_8_ = uVar742;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar734;
    auVar422._8_8_ = 0;
    auVar422._0_8_ = uVar740 * 2;
    auVar167 = auVar63 * auVar422 + auVar62 * auVar421 + (auVar687 >> 0x34);
    uVar750 = auVar167._0_8_;
    auVar688._8_8_ = 0;
    auVar688._0_8_ = auVar167._8_8_ << 0xc | uVar750 >> 0x34;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = (uVar750 & 0xfffffffffffff) << 4 | (ulong)(auVar687._6_2_ & 0xf);
    auVar167 = auVar64 * ZEXT816(0x1000003d1) + auVar61 * auVar420;
    uVar753 = auVar167._0_8_;
    auVar689._8_8_ = 0;
    auVar689._0_8_ = auVar167._8_8_ << 0xc | uVar753 >> 0x34;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar742;
    auVar423._8_8_ = 0;
    auVar423._0_8_ = uVar755;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar733;
    auVar424._8_8_ = 0;
    auVar424._0_8_ = uVar740;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar734;
    auVar425._8_8_ = 0;
    auVar425._0_8_ = uVar734;
    auVar688 = auVar67 * auVar425 + auVar66 * auVar424 + auVar688;
    uVar750 = auVar688._0_8_;
    auVar690._8_8_ = 0;
    auVar690._0_8_ = auVar688._8_8_ << 0xc | uVar750 >> 0x34;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar750 & 0xfffffffffffff;
    auVar689 = auVar65 * auVar423 + auVar68 * ZEXT816(0x1000003d10) + auVar689;
    uVar750 = auVar689._0_8_;
    auVar691._8_8_ = 0;
    auVar691._0_8_ = auVar689._8_8_ << 0xc | uVar750 >> 0x34;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar740;
    auVar426._8_8_ = 0;
    auVar426._0_8_ = uVar755;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar742;
    auVar427._8_8_ = 0;
    auVar427._0_8_ = uVar742;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar733;
    auVar428._8_8_ = 0;
    auVar428._0_8_ = uVar734;
    auVar690 = auVar71 * auVar428 + auVar690;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auVar690._0_8_;
    auVar691 = auVar72 * ZEXT816(0x1000003d10) + auVar70 * auVar427 + auVar69 * auVar426 + auVar691;
    auVar167 = auVar691 >> 0x34;
    auVar693._8_8_ = 0;
    auVar693._0_8_ = auVar167._0_8_;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auVar690._8_8_;
    auVar692._8_8_ = auVar167._8_8_;
    auVar692._0_8_ = uVar747 & 0xffffffffffffe;
    auVar693 = auVar73 * ZEXT816(0x1000003d10000) + auVar692 + auVar693;
    uVar733 = auVar693._0_8_;
    uVar753 = uVar753 & 0xfffffffffffff;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar753;
    auVar429._8_8_ = 0;
    auVar429._0_8_ = uVar734;
    uVar729 = (auVar693._8_8_ << 0xc | uVar733 >> 0x34) + (auVar687._0_8_ & 0xffffffffffff);
    uVar750 = uVar750 & 0xfffffffffffff;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar750;
    auVar430._8_8_ = 0;
    auVar430._0_8_ = uVar740;
    uVar747 = auVar691._0_8_ & 0xfffffffffffff;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar747;
    auVar431._8_8_ = 0;
    auVar431._0_8_ = uVar742;
    uVar733 = uVar733 & 0xfffffffffffff;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar733;
    auVar432._8_8_ = 0;
    auVar432._0_8_ = uVar736;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar729;
    auVar433._8_8_ = 0;
    auVar433._0_8_ = uVar746;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = SUB168(auVar78 * auVar433,0);
    auVar169 = auVar75 * auVar430 + auVar74 * auVar429 + auVar76 * auVar431 + auVar77 * auVar432 +
               auVar79 * ZEXT816(0x1000003d10);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar753;
    auVar434._8_8_ = 0;
    auVar434._0_8_ = uVar746;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar750;
    auVar435._8_8_ = 0;
    auVar435._0_8_ = uVar734;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar747;
    auVar436._8_8_ = 0;
    auVar436._0_8_ = uVar740;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar733;
    auVar437._8_8_ = 0;
    auVar437._0_8_ = uVar742;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar729;
    auVar438._8_8_ = 0;
    auVar438._0_8_ = uVar736;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = SUB168(auVar78 * auVar433,8);
    auVar167 = auVar85 * ZEXT816(0x1000003d10000) +
               auVar84 * auVar438 +
               auVar83 * auVar437 + auVar82 * auVar436 + auVar81 * auVar435 + auVar80 * auVar434 +
               (auVar169 >> 0x34);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar753;
    auVar439._8_8_ = 0;
    auVar439._0_8_ = uVar736;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar750;
    auVar440._8_8_ = 0;
    auVar440._0_8_ = uVar746;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar747;
    auVar441._8_8_ = 0;
    auVar441._0_8_ = uVar734;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar733;
    auVar442._8_8_ = 0;
    auVar442._0_8_ = uVar740;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar729;
    auVar443._8_8_ = 0;
    auVar443._0_8_ = uVar742;
    auVar168 = auVar90 * auVar443 + auVar89 * auVar442 + auVar88 * auVar441 + auVar87 * auVar440 +
               (auVar167 >> 0x34);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
    auVar170 = auVar91 * ZEXT816(0x1000003d1) + auVar86 * auVar439;
    uVar755 = auVar170._0_8_;
    auVar694._8_8_ = 0;
    auVar694._0_8_ = auVar170._8_8_ * 0x1000 | uVar755 >> 0x34;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar753;
    auVar444._8_8_ = 0;
    auVar444._0_8_ = uVar742;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar750;
    auVar445._8_8_ = 0;
    auVar445._0_8_ = uVar736;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar747;
    auVar446._8_8_ = 0;
    auVar446._0_8_ = uVar746;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar733;
    auVar447._8_8_ = 0;
    auVar447._0_8_ = uVar734;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar729;
    auVar448._8_8_ = 0;
    auVar448._0_8_ = uVar740;
    auVar168 = auVar96 * auVar448 + auVar95 * auVar447 + auVar94 * auVar446 + (auVar168 >> 0x34);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
    auVar694 = auVar97 * ZEXT816(0x1000003d10) + auVar93 * auVar445 + auVar92 * auVar444 + auVar694;
    uVar743 = auVar694._0_8_;
    auVar695._8_8_ = 0;
    auVar695._0_8_ = auVar694._8_8_ << 0xc | uVar743 >> 0x34;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar753;
    auVar449._8_8_ = 0;
    auVar449._0_8_ = uVar740;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar750;
    auVar450._8_8_ = 0;
    auVar450._0_8_ = uVar742;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar747;
    auVar451._8_8_ = 0;
    auVar451._0_8_ = uVar736;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar733;
    auVar452._8_8_ = 0;
    auVar452._0_8_ = uVar746;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar729;
    auVar453._8_8_ = 0;
    auVar453._0_8_ = uVar734;
    auVar168 = auVar102 * auVar453 + auVar101 * auVar452 + (auVar168 >> 0x34);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = auVar168._0_8_;
    auVar695 = auVar103 * ZEXT816(0x1000003d10) +
               auVar100 * auVar451 + auVar99 * auVar450 + auVar98 * auVar449 + auVar695;
    auVar170 = auVar695 >> 0x34;
    auVar697._8_8_ = 0;
    auVar697._0_8_ = auVar170._0_8_;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = auVar168._8_8_;
    auVar696._8_8_ = auVar170._8_8_;
    auVar696._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
    auVar697 = auVar104 * ZEXT816(0x1000003d10000) + auVar696 + auVar697;
    uVar753 = auVar697._0_8_;
    uVar750 = (auVar697._8_8_ << 0xc | uVar753 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
    uVar753 = uVar753 & 0xfffffffffffff;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar753;
    auVar454._8_8_ = 0;
    auVar454._0_8_ = s.n[0];
    uVar733 = auVar695._0_8_ & 0xfffffffffffff;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar733;
    auVar455._8_8_ = 0;
    auVar455._0_8_ = s.n[1];
    uVar743 = uVar743 & 0xfffffffffffff;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar743;
    auVar456._8_8_ = 0;
    auVar456._0_8_ = s.n[2];
    uVar755 = (uVar755 & 0xfffffffffffff) + 7;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar755;
    auVar457._8_8_ = 0;
    auVar457._0_8_ = s.n[3];
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar750;
    auVar458._8_8_ = 0;
    auVar458._0_8_ = s.n[4];
    auVar110._8_8_ = 0;
    auVar110._0_8_ = SUB168(auVar109 * auVar458,0);
    auVar167 = auVar110 * ZEXT816(0x1000003d10) +
               auVar108 * auVar457 + auVar107 * auVar456 + auVar106 * auVar455 + auVar105 * auVar454
    ;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar750;
    auVar459._8_8_ = 0;
    auVar459._0_8_ = s.n[0];
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar753;
    auVar460._8_8_ = 0;
    auVar460._0_8_ = s.n[1];
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar733;
    auVar461._8_8_ = 0;
    auVar461._0_8_ = s.n[2];
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar743;
    auVar462._8_8_ = 0;
    auVar462._0_8_ = s.n[3];
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar755;
    auVar463._8_8_ = 0;
    auVar463._0_8_ = s.n[4];
    auVar116._8_8_ = 0;
    auVar116._0_8_ = SUB168(auVar109 * auVar458,8);
    auVar168 = auVar116 * ZEXT816(0x1000003d10000) +
               auVar112 * auVar460 + auVar113 * auVar461 + auVar115 * auVar463 + auVar114 * auVar462
               + auVar111 * auVar459 + (auVar167 >> 0x34);
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar755;
    auVar464._8_8_ = 0;
    auVar464._0_8_ = s.n[0];
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar750;
    auVar465._8_8_ = 0;
    auVar465._0_8_ = s.n[1];
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar753;
    auVar466._8_8_ = 0;
    auVar466._0_8_ = s.n[2];
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar733;
    auVar467._8_8_ = 0;
    auVar467._0_8_ = s.n[3];
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar743;
    auVar468._8_8_ = 0;
    auVar468._0_8_ = s.n[4];
    auVar169 = (auVar168 >> 0x34) +
               auVar121 * auVar468 + auVar120 * auVar467 + auVar119 * auVar466 + auVar118 * auVar465
    ;
    uVar747 = auVar169._0_8_;
    uVar729 = auVar169._8_8_;
    auVar698._8_8_ = uVar729 >> 0x34;
    auVar698._0_8_ = uVar729 * 0x1000 | uVar747 >> 0x34;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar747 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar168._6_2_ & 0xf);
    auVar169 = auVar122 * ZEXT816(0x1000003d1) + auVar117 * auVar464;
    local_118.n[0] = auVar169._0_8_;
    auVar699._8_8_ = 0;
    auVar699._0_8_ = auVar169._8_8_ * 0x1000 | local_118.n[0] >> 0x34;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uVar743;
    auVar469._8_8_ = 0;
    auVar469._0_8_ = s.n[0];
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar755;
    auVar470._8_8_ = 0;
    auVar470._0_8_ = s.n[1];
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar750;
    auVar471._8_8_ = 0;
    auVar471._0_8_ = s.n[2];
    local_118.n[0] = local_118.n[0] & 0xfffffffffffff;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar753;
    auVar472._8_8_ = 0;
    auVar472._0_8_ = s.n[3];
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar733;
    auVar473._8_8_ = 0;
    auVar473._0_8_ = s.n[4];
    auVar698 = auVar125 * auVar471 + auVar127 * auVar473 + auVar126 * auVar472 + auVar698;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = auVar698._0_8_ & 0xfffffffffffff;
    auVar699 = auVar128 * ZEXT816(0x1000003d10) + auVar124 * auVar470 + auVar123 * auVar469 +
               auVar699;
    local_118.n[1] = auVar699._0_8_ & 0xfffffffffffff;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar733;
    auVar474._8_8_ = 0;
    auVar474._0_8_ = s.n[0];
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar743;
    auVar475._8_8_ = 0;
    auVar475._0_8_ = s.n[1];
    auVar131._8_8_ = 0;
    auVar131._0_8_ = uVar755;
    auVar476._8_8_ = 0;
    auVar476._0_8_ = s.n[2];
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar750;
    auVar477._8_8_ = 0;
    auVar477._0_8_ = s.n[3];
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar753;
    auVar478._8_8_ = 0;
    auVar478._0_8_ = s.n[4];
    auVar169 = auVar133 * auVar478 + auVar132 * auVar477 + (auVar698 >> 0x34);
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auVar169._0_8_;
    auVar170 = auVar134 * ZEXT816(0x1000003d10) +
               auVar131 * auVar476 + auVar130 * auVar475 + auVar129 * auVar474 + (auVar699 >> 0x34);
    auVar171 = auVar170 >> 0x34;
    auVar701._8_8_ = 0;
    auVar701._0_8_ = auVar171._0_8_;
    local_118.n[2] = auVar170._0_8_ & 0xfffffffffffff;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auVar169._8_8_;
    auVar700._8_8_ = auVar171._8_8_;
    auVar700._0_8_ = auVar167._0_8_ & 0xfffffffffffff;
    auVar701 = auVar135 * ZEXT816(0x1000003d10000) + auVar700 + auVar701;
    uVar747 = auVar701._0_8_;
    local_118.n[3] = uVar747 & 0xfffffffffffff;
    local_118.n[4] = (auVar701._8_8_ << 0xc | uVar747 >> 0x34) + (auVar168._0_8_ & 0xffffffffffff);
    iVar728 = secp256k1_fe_impl_is_square_var(&local_118);
    if (iVar728 == 0) {
      return 0;
    }
    secp256k1_fe_impl_inv_var(&s,&s);
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar753;
    auVar479._8_8_ = 0;
    auVar479._0_8_ = s.n[0];
    auVar137._8_8_ = 0;
    auVar137._0_8_ = uVar733;
    auVar480._8_8_ = 0;
    auVar480._0_8_ = s.n[1];
    auVar138._8_8_ = 0;
    auVar138._0_8_ = uVar743;
    auVar481._8_8_ = 0;
    auVar481._0_8_ = s.n[2];
    auVar139._8_8_ = 0;
    auVar139._0_8_ = s.n[3];
    auVar482._8_8_ = 0;
    auVar482._0_8_ = uVar755;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = s.n[4];
    auVar483._8_8_ = 0;
    auVar483._0_8_ = uVar750;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = SUB168(auVar140 * auVar483,0);
    auVar170 = auVar137 * auVar480 + auVar136 * auVar479 + auVar138 * auVar481 + auVar139 * auVar482
               + auVar141 * ZEXT816(0x1000003d10);
    auVar142._8_8_ = 0;
    auVar142._0_8_ = s.n[0];
    auVar484._8_8_ = 0;
    auVar484._0_8_ = uVar750;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = uVar753;
    auVar485._8_8_ = 0;
    auVar485._0_8_ = s.n[1];
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar733;
    auVar486._8_8_ = 0;
    auVar486._0_8_ = s.n[2];
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar743;
    auVar487._8_8_ = 0;
    auVar487._0_8_ = s.n[3];
    auVar146._8_8_ = 0;
    auVar146._0_8_ = s.n[4];
    auVar488._8_8_ = 0;
    auVar488._0_8_ = uVar755;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = SUB168(auVar140 * auVar483,8);
    auVar167 = auVar147 * ZEXT816(0x1000003d10000) +
               auVar146 * auVar488 +
               auVar145 * auVar487 + auVar144 * auVar486 + auVar143 * auVar485 + auVar142 * auVar484
               + (auVar170 >> 0x34);
    auVar148._8_8_ = 0;
    auVar148._0_8_ = s.n[0];
    auVar489._8_8_ = 0;
    auVar489._0_8_ = uVar755;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = s.n[1];
    auVar490._8_8_ = 0;
    auVar490._0_8_ = uVar750;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar753;
    auVar491._8_8_ = 0;
    auVar491._0_8_ = s.n[2];
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar733;
    auVar492._8_8_ = 0;
    auVar492._0_8_ = s.n[3];
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar743;
    auVar493._8_8_ = 0;
    auVar493._0_8_ = s.n[4];
    auVar168 = auVar152 * auVar493 + auVar149 * auVar490 + auVar150 * auVar491 + auVar151 * auVar492
               + (auVar167 >> 0x34);
    auVar153._8_8_ = 0;
    auVar153._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
    auVar169 = auVar153 * ZEXT816(0x1000003d1) + auVar148 * auVar489;
    uVar747 = auVar169._0_8_;
    uVar729 = auVar169._8_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar743;
    auVar494._8_8_ = 0;
    auVar494._0_8_ = s.n[0];
    auVar155._8_8_ = 0;
    auVar155._0_8_ = s.n[1];
    auVar495._8_8_ = 0;
    auVar495._0_8_ = uVar755;
    auVar669._8_8_ = uVar729 >> 0x34;
    auVar669._0_8_ = uVar729 * 0x1000 | uVar747 >> 0x34;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = s.n[2];
    auVar496._8_8_ = 0;
    auVar496._0_8_ = uVar750;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar753;
    auVar497._8_8_ = 0;
    auVar497._0_8_ = s.n[3];
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar733;
    auVar498._8_8_ = 0;
    auVar498._0_8_ = s.n[4];
    auVar168 = auVar158 * auVar498 + auVar157 * auVar497 + auVar156 * auVar496 + (auVar168 >> 0x34);
    auVar159._8_8_ = 0;
    auVar159._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
    auVar669 = auVar159 * ZEXT816(0x1000003d10) + auVar155 * auVar495 + auVar154 * auVar494 +
               auVar669;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar733;
    auVar499._8_8_ = 0;
    auVar499._0_8_ = s.n[0];
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar743;
    auVar500._8_8_ = 0;
    auVar500._0_8_ = s.n[1];
    auVar162._8_8_ = 0;
    auVar162._0_8_ = s.n[2];
    auVar501._8_8_ = 0;
    auVar501._0_8_ = uVar755;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = s.n[3];
    auVar502._8_8_ = 0;
    auVar502._0_8_ = uVar750;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar753;
    auVar503._8_8_ = 0;
    auVar503._0_8_ = s.n[4];
    auVar168 = auVar164 * auVar503 + auVar163 * auVar502 + (auVar168 >> 0x34);
    auVar165._8_8_ = 0;
    auVar165._0_8_ = auVar168._0_8_;
    auVar169 = auVar165 * ZEXT816(0x1000003d10) +
               auVar162 * auVar501 + auVar161 * auVar500 + auVar160 * auVar499 + (auVar669 >> 0x34);
    auVar171 = auVar169 >> 0x34;
    auVar703._8_8_ = 0;
    auVar703._0_8_ = auVar171._0_8_;
    s.n[2] = auVar169._0_8_ & 0xfffffffffffff;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = auVar168._8_8_;
    auVar702._8_8_ = auVar171._8_8_;
    auVar702._0_8_ = auVar170._0_8_ & 0xfffffffffffff;
    auVar703 = auVar166 * ZEXT816(0x1000003d10000) + auVar702 + auVar703;
    uVar755 = auVar703._0_8_;
    s.n[3] = uVar755 & 0xfffffffffffff;
    s.n[4] = (auVar703._8_8_ << 0xc | uVar755 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
    local_f0.n[0] = uVar744;
    local_f0.n[1] = uVar752;
    local_f0.n[2] = uVar749;
    local_f0.n[3] = uVar732;
    local_f0.n[4] = uVar745;
    s.n[0] = uVar747 & 0xfffffffffffff;
    s.n[1] = auVar669._0_8_ & 0xfffffffffffff;
  }
  else {
    uVar755 = 0x3ffffbfffff0bc - uVar736;
    uVar733 = 0x3ffffffffffffc - uVar742;
    uVar747 = 0x3ffffffffffffc - uVar740;
    uVar753 = 0x3ffffffffffffc - uVar734;
    uVar750 = 0x3fffffffffffc - uVar746;
    uVar744 = uVar744 + uVar755;
    uVar752 = uVar752 + uVar733;
    uVar749 = uVar749 + uVar747;
    uVar732 = uVar732 + uVar753;
    uVar745 = uVar745 + uVar750;
    local_118.n[0] = uVar755;
    local_118.n[1] = uVar733;
    local_118.n[2] = uVar747;
    local_118.n[3] = uVar753;
    local_118.n[4] = uVar750;
    s.n[0] = uVar744;
    s.n[1] = uVar752;
    s.n[2] = uVar749;
    s.n[3] = uVar732;
    s.n[4] = uVar745;
    iVar728 = secp256k1_fe_impl_is_square_var(&s);
    if (iVar728 == 0) {
      return 0;
    }
    uVar743 = uVar736 * 2;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar734;
    auVar504._8_8_ = 0;
    auVar504._0_8_ = uVar743;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar740;
    auVar505._8_8_ = 0;
    auVar505._0_8_ = uVar742 * 2;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar746;
    auVar506._8_8_ = 0;
    auVar506._0_8_ = uVar746;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = SUB168(auVar169 * auVar506,0);
    auVar167 = auVar170 * ZEXT816(0x1000003d10) + auVar168 * auVar505 + auVar167 * auVar504;
    uVar737 = auVar167._0_8_;
    auVar704._8_8_ = 0;
    auVar704._0_8_ = auVar167._8_8_ << 0xc | uVar737 >> 0x34;
    uVar729 = uVar746 * 2;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar729;
    auVar507._8_8_ = 0;
    auVar507._0_8_ = uVar736;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar734;
    auVar508._8_8_ = 0;
    auVar508._0_8_ = uVar742 * 2;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar740;
    auVar509._8_8_ = 0;
    auVar509._0_8_ = uVar740;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = SUB168(auVar169 * auVar506,8);
    auVar704 = auVar174 * ZEXT816(0x1000003d10000) +
               auVar171 * auVar507 + auVar173 * auVar509 + auVar172 * auVar508 + auVar704;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar736;
    auVar510._8_8_ = 0;
    auVar510._0_8_ = uVar736;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar729;
    auVar511._8_8_ = 0;
    auVar511._0_8_ = uVar742;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar734;
    auVar512._8_8_ = 0;
    auVar512._0_8_ = uVar740 * 2;
    auVar167 = auVar177 * auVar512 + auVar176 * auVar511 + (auVar704 >> 0x34);
    uVar730 = auVar167._0_8_;
    auVar705._8_8_ = 0;
    auVar705._0_8_ = auVar167._8_8_ << 0xc | uVar730 >> 0x34;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = (uVar730 & 0xfffffffffffff) << 4 | (ulong)(auVar704._6_2_ & 0xf);
    auVar167 = auVar178 * ZEXT816(0x1000003d1) + auVar175 * auVar510;
    uVar748 = auVar167._0_8_;
    auVar706._8_8_ = 0;
    auVar706._0_8_ = auVar167._8_8_ << 0xc | uVar748 >> 0x34;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar742;
    auVar513._8_8_ = 0;
    auVar513._0_8_ = uVar743;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar729;
    auVar514._8_8_ = 0;
    auVar514._0_8_ = uVar740;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = uVar734;
    auVar515._8_8_ = 0;
    auVar515._0_8_ = uVar734;
    auVar705 = auVar181 * auVar515 + auVar180 * auVar514 + auVar705;
    uVar730 = auVar705._0_8_;
    auVar707._8_8_ = 0;
    auVar707._0_8_ = auVar705._8_8_ << 0xc | uVar730 >> 0x34;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uVar730 & 0xfffffffffffff;
    auVar706 = auVar182 * ZEXT816(0x1000003d10) + auVar179 * auVar513 + auVar706;
    uVar751 = auVar706._0_8_;
    auVar708._8_8_ = 0;
    auVar708._0_8_ = auVar706._8_8_ << 0xc | uVar751 >> 0x34;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar740;
    auVar516._8_8_ = 0;
    auVar516._0_8_ = uVar743;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar742;
    auVar517._8_8_ = 0;
    auVar517._0_8_ = uVar742;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar729;
    auVar518._8_8_ = 0;
    auVar518._0_8_ = uVar734;
    auVar707 = auVar185 * auVar518 + auVar707;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = auVar707._0_8_;
    auVar708 = auVar186 * ZEXT816(0x1000003d10) + auVar184 * auVar517 + auVar183 * auVar516 +
               auVar708;
    auVar167 = auVar708 >> 0x34;
    auVar709._8_8_ = auVar167._8_8_;
    auVar709._0_8_ = uVar737 & 0xffffffffffffe;
    auVar710._8_8_ = 0;
    auVar710._0_8_ = auVar167._0_8_;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = auVar707._8_8_;
    auVar710 = auVar187 * ZEXT816(0x1000003d10000) + auVar709 + auVar710;
    uVar743 = auVar710._0_8_;
    uVar737 = uVar743 & 0xfffffffffffff;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar737;
    auVar519._8_8_ = 0;
    auVar519._0_8_ = uVar744;
    uVar738 = (auVar710._8_8_ << 0xc | uVar743 >> 0x34) + (auVar704._0_8_ & 0xffffffffffff);
    uVar756 = auVar708._0_8_ & 0xfffffffffffff;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar756;
    auVar520._8_8_ = 0;
    auVar520._0_8_ = uVar752;
    uVar751 = uVar751 & 0xfffffffffffff;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar751;
    auVar521._8_8_ = 0;
    auVar521._0_8_ = uVar749;
    uVar748 = uVar748 & 0xfffffffffffff;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar748;
    auVar522._8_8_ = 0;
    auVar522._0_8_ = uVar732;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar745;
    auVar523._8_8_ = 0;
    auVar523._0_8_ = uVar738;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = SUB168(auVar192 * auVar523,0);
    auVar170 = auVar189 * auVar520 + auVar188 * auVar519 + auVar190 * auVar521 + auVar191 * auVar522
               + auVar193 * ZEXT816(0x1000003d10);
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar744;
    auVar524._8_8_ = 0;
    auVar524._0_8_ = uVar738;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar737;
    auVar525._8_8_ = 0;
    auVar525._0_8_ = uVar752;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar756;
    auVar526._8_8_ = 0;
    auVar526._0_8_ = uVar749;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar751;
    auVar527._8_8_ = 0;
    auVar527._0_8_ = uVar732;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar748;
    auVar528._8_8_ = 0;
    auVar528._0_8_ = uVar745;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = SUB168(auVar192 * auVar523,8);
    auVar167 = auVar199 * ZEXT816(0x1000003d10000) +
               auVar198 * auVar528 +
               auVar197 * auVar527 + auVar196 * auVar526 + auVar195 * auVar525 + auVar194 * auVar524
               + (auVar170 >> 0x34);
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar748;
    auVar529._8_8_ = 0;
    auVar529._0_8_ = uVar744;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar752;
    auVar530._8_8_ = 0;
    auVar530._0_8_ = uVar738;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar737;
    auVar531._8_8_ = 0;
    auVar531._0_8_ = uVar749;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar756;
    auVar532._8_8_ = 0;
    auVar532._0_8_ = uVar732;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar751;
    auVar533._8_8_ = 0;
    auVar533._0_8_ = uVar745;
    auVar168 = auVar204 * auVar533 + auVar201 * auVar530 + auVar202 * auVar531 + auVar203 * auVar532
               + (auVar167 >> 0x34);
    auVar205._8_8_ = 0;
    auVar205._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
    auVar169 = auVar200 * auVar529 + auVar205 * ZEXT816(0x1000003d1);
    uVar743 = auVar169._0_8_;
    uVar729 = auVar169._8_8_;
    auVar670._8_8_ = uVar729 >> 0x34;
    auVar670._0_8_ = uVar729 * 0x1000 | uVar743 >> 0x34;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar751;
    auVar534._8_8_ = 0;
    auVar534._0_8_ = uVar744;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar748;
    auVar535._8_8_ = 0;
    auVar535._0_8_ = uVar752;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar749;
    auVar536._8_8_ = 0;
    auVar536._0_8_ = uVar738;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar737;
    auVar537._8_8_ = 0;
    auVar537._0_8_ = uVar732;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar756;
    auVar538._8_8_ = 0;
    auVar538._0_8_ = uVar745;
    auVar168 = auVar210 * auVar538 + auVar209 * auVar537 + auVar208 * auVar536 + (auVar168 >> 0x34);
    auVar211._8_8_ = 0;
    auVar211._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
    auVar670 = auVar211 * ZEXT816(0x1000003d10) + auVar206 * auVar534 + auVar207 * auVar535 +
               auVar670;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = uVar756;
    auVar539._8_8_ = 0;
    auVar539._0_8_ = uVar744;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = uVar751;
    auVar540._8_8_ = 0;
    auVar540._0_8_ = uVar752;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uVar748;
    auVar541._8_8_ = 0;
    auVar541._0_8_ = uVar749;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar732;
    auVar542._8_8_ = 0;
    auVar542._0_8_ = uVar738;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar737;
    auVar543._8_8_ = 0;
    auVar543._0_8_ = uVar745;
    auVar168 = auVar216 * auVar543 + auVar215 * auVar542 + (auVar168 >> 0x34);
    auVar217._8_8_ = 0;
    auVar217._0_8_ = auVar168._0_8_;
    auVar169 = auVar217 * ZEXT816(0x1000003d10) +
               auVar214 * auVar541 + auVar213 * auVar540 + auVar212 * auVar539 + (auVar670 >> 0x34);
    auVar171 = auVar169 >> 0x34;
    auVar712._8_8_ = 0;
    auVar712._0_8_ = auVar171._0_8_;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = auVar168._8_8_;
    auVar711._8_8_ = auVar171._8_8_;
    auVar711._0_8_ = auVar170._0_8_ & 0xfffffffffffff;
    auVar712 = auVar218 * ZEXT816(0x1000003d10000) + auVar711 + auVar712;
    uVar730 = auVar712._0_8_;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar748;
    auVar544._8_8_ = 0;
    auVar544._0_8_ = uVar734;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar751;
    auVar545._8_8_ = 0;
    auVar545._0_8_ = uVar740;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = uVar756;
    auVar546._8_8_ = 0;
    auVar546._0_8_ = uVar742;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = uVar737;
    auVar547._8_8_ = 0;
    auVar547._0_8_ = uVar736;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = uVar738;
    auVar548._8_8_ = 0;
    auVar548._0_8_ = uVar746;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = SUB168(auVar223 * auVar548,0);
    auVar171 = auVar220 * auVar545 + auVar219 * auVar544 + auVar221 * auVar546 + auVar222 * auVar547
               + auVar224 * ZEXT816(0x1000003d10);
    auVar225._8_8_ = 0;
    auVar225._0_8_ = uVar748;
    auVar549._8_8_ = 0;
    auVar549._0_8_ = uVar746;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = uVar751;
    auVar550._8_8_ = 0;
    auVar550._0_8_ = uVar734;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = uVar756;
    auVar551._8_8_ = 0;
    auVar551._0_8_ = uVar740;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar737;
    auVar552._8_8_ = 0;
    auVar552._0_8_ = uVar742;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = uVar738;
    auVar553._8_8_ = 0;
    auVar553._0_8_ = uVar736;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = SUB168(auVar223 * auVar548,8);
    auVar168 = auVar230 * ZEXT816(0x1000003d10000) +
               auVar229 * auVar553 +
               auVar228 * auVar552 + auVar227 * auVar551 + auVar226 * auVar550 + auVar225 * auVar549
               + (auVar171 >> 0x34);
    auVar231._8_8_ = 0;
    auVar231._0_8_ = uVar748;
    auVar554._8_8_ = 0;
    auVar554._0_8_ = uVar736;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar751;
    auVar555._8_8_ = 0;
    auVar555._0_8_ = uVar746;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar756;
    auVar556._8_8_ = 0;
    auVar556._0_8_ = uVar734;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uVar737;
    auVar557._8_8_ = 0;
    auVar557._0_8_ = uVar740;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar738;
    auVar558._8_8_ = 0;
    auVar558._0_8_ = uVar742;
    auVar170 = auVar235 * auVar558 + auVar234 * auVar557 + auVar233 * auVar556 + auVar232 * auVar555
               + (auVar168 >> 0x34);
    auVar236._8_8_ = 0;
    auVar236._0_8_ = (auVar170._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar168._6_2_ & 0xf);
    auVar172 = auVar231 * auVar554 + auVar236 * ZEXT816(0x1000003d1);
    uVar729 = auVar172._0_8_;
    auVar727._8_8_ = 0;
    auVar727._0_8_ = auVar172._8_8_ * 0x1000 | uVar729 >> 0x34;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar748;
    auVar559._8_8_ = 0;
    auVar559._0_8_ = uVar742;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar751;
    auVar560._8_8_ = 0;
    auVar560._0_8_ = uVar736;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar756;
    auVar561._8_8_ = 0;
    auVar561._0_8_ = uVar746;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = uVar737;
    auVar562._8_8_ = 0;
    auVar562._0_8_ = uVar734;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = uVar738;
    auVar563._8_8_ = 0;
    auVar563._0_8_ = uVar740;
    auVar170 = auVar241 * auVar563 + auVar240 * auVar562 + auVar239 * auVar561 + (auVar170 >> 0x34);
    auVar242._8_8_ = 0;
    auVar242._0_8_ = auVar170._0_8_ & 0xfffffffffffff;
    auVar727 = auVar242 * ZEXT816(0x1000003d10) + auVar237 * auVar559 + auVar238 * auVar560 +
               auVar727;
    uVar735 = auVar727._0_8_;
    auVar713._8_8_ = 0;
    auVar713._0_8_ = auVar727._8_8_ * 0x1000 | uVar735 >> 0x34;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar748;
    auVar564._8_8_ = 0;
    auVar564._0_8_ = uVar740;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar751;
    auVar565._8_8_ = 0;
    auVar565._0_8_ = uVar742;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = uVar756;
    auVar566._8_8_ = 0;
    auVar566._0_8_ = uVar736;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar737;
    auVar567._8_8_ = 0;
    auVar567._0_8_ = uVar746;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar738;
    auVar568._8_8_ = 0;
    auVar568._0_8_ = uVar734;
    auVar170 = auVar247 * auVar568 + auVar246 * auVar567 + (auVar170 >> 0x34);
    auVar248._8_8_ = 0;
    auVar248._0_8_ = auVar170._0_8_;
    auVar713 = auVar248 * ZEXT816(0x1000003d10) +
               auVar245 * auVar566 + auVar244 * auVar565 + auVar243 * auVar564 + auVar713;
    auVar172 = auVar713 >> 0x34;
    auVar715._8_8_ = 0;
    auVar715._0_8_ = auVar172._0_8_;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = auVar170._8_8_;
    auVar714._8_8_ = auVar172._8_8_;
    auVar714._0_8_ = auVar171._0_8_ & 0xfffffffffffff;
    auVar715 = auVar249 * ZEXT816(0x1000003d10000) + auVar714 + auVar715;
    uVar738 = auVar715._0_8_;
    uVar748 = (uVar735 & 0xfffffffffffff) * 4 + (auVar670._0_8_ & 0xfffffffffffff) * 3;
    uVar751 = (auVar713._0_8_ & 0xfffffffffffff) * 4 + (auVar169._0_8_ & 0xfffffffffffff) * 3;
    uVar735 = (uVar738 & 0xfffffffffffff) * 4 + (uVar730 & 0xfffffffffffff) * 3;
    uVar737 = (uVar729 * 4 & 0x3ffffffffffffc) + (uVar743 & 0xfffffffffffff) * 3 + 0x1c;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = uVar737;
    auVar569._8_8_ = 0;
    auVar569._0_8_ = uVar732;
    uVar743 = ((auVar712._8_8_ << 0xc | uVar730 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff)) * 3 +
              ((auVar715._8_8_ << 0xc | uVar738 >> 0x34) + (auVar168._0_8_ & 0xffffffffffff)) * 4;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = uVar748;
    auVar570._8_8_ = 0;
    auVar570._0_8_ = uVar749;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = uVar751;
    auVar571._8_8_ = 0;
    auVar571._0_8_ = uVar752;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = uVar735;
    auVar572._8_8_ = 0;
    auVar572._0_8_ = uVar744;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar743;
    auVar573._8_8_ = 0;
    auVar573._0_8_ = uVar745;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = SUB168(auVar254 * auVar573,0);
    auVar167 = auVar250 * auVar569 + auVar251 * auVar570 + auVar252 * auVar571 + auVar253 * auVar572
               + auVar255 * ZEXT816(0x1000003d10);
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uVar737;
    auVar574._8_8_ = 0;
    auVar574._0_8_ = uVar745;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar748;
    auVar575._8_8_ = 0;
    auVar575._0_8_ = uVar732;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar751;
    auVar576._8_8_ = 0;
    auVar576._0_8_ = uVar749;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = uVar735;
    auVar577._8_8_ = 0;
    auVar577._0_8_ = uVar752;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = uVar743;
    auVar578._8_8_ = 0;
    auVar578._0_8_ = uVar744;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = SUB168(auVar254 * auVar573,8);
    auVar168 = auVar261 * ZEXT816(0x1000003d10000) +
               auVar260 * auVar578 +
               auVar259 * auVar577 + auVar258 * auVar576 + auVar256 * auVar574 + auVar257 * auVar575
               + (auVar167 >> 0x34);
    auVar262._8_8_ = 0;
    auVar262._0_8_ = uVar737;
    auVar579._8_8_ = 0;
    auVar579._0_8_ = uVar744;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = uVar748;
    auVar580._8_8_ = 0;
    auVar580._0_8_ = uVar745;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = uVar751;
    auVar581._8_8_ = 0;
    auVar581._0_8_ = uVar732;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = uVar735;
    auVar582._8_8_ = 0;
    auVar582._0_8_ = uVar749;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = uVar743;
    auVar583._8_8_ = 0;
    auVar583._0_8_ = uVar752;
    auVar169 = auVar266 * auVar583 + auVar263 * auVar580 + auVar264 * auVar581 + auVar265 * auVar582
               + (auVar168 >> 0x34);
    auVar267._8_8_ = 0;
    auVar267._0_8_ = (auVar169._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar168._6_2_ & 0xf);
    auVar170 = auVar262 * auVar579 + auVar267 * ZEXT816(0x1000003d1);
    uVar729 = auVar170._0_8_;
    uVar730 = auVar170._8_8_;
    auVar671._8_8_ = uVar730 >> 0x34;
    auVar671._0_8_ = uVar730 * 0x1000 | uVar729 >> 0x34;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = uVar737;
    auVar584._8_8_ = 0;
    auVar584._0_8_ = uVar752;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = uVar748;
    auVar585._8_8_ = 0;
    auVar585._0_8_ = uVar744;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = uVar751;
    auVar586._8_8_ = 0;
    auVar586._0_8_ = uVar745;
    auVar271._8_8_ = 0;
    auVar271._0_8_ = uVar735;
    auVar587._8_8_ = 0;
    auVar587._0_8_ = uVar732;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = uVar743;
    auVar588._8_8_ = 0;
    auVar588._0_8_ = uVar749;
    auVar169 = auVar272 * auVar588 + auVar271 * auVar587 + auVar270 * auVar586 + (auVar169 >> 0x34);
    auVar273._8_8_ = 0;
    auVar273._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
    auVar671 = auVar273 * ZEXT816(0x1000003d10) + auVar268 * auVar584 + auVar269 * auVar585 +
               auVar671;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = uVar737;
    auVar589._8_8_ = 0;
    auVar589._0_8_ = uVar749;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = uVar748;
    auVar590._8_8_ = 0;
    auVar590._0_8_ = uVar752;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = uVar751;
    auVar591._8_8_ = 0;
    auVar591._0_8_ = uVar744;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = uVar735;
    auVar592._8_8_ = 0;
    auVar592._0_8_ = uVar745;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = uVar743;
    auVar593._8_8_ = 0;
    auVar593._0_8_ = uVar732;
    auVar169 = auVar278 * auVar593 + auVar277 * auVar592 + (auVar169 >> 0x34);
    auVar279._8_8_ = 0;
    auVar279._0_8_ = auVar169._0_8_;
    auVar170 = auVar279 * ZEXT816(0x1000003d10) +
               auVar276 * auVar591 + auVar275 * auVar590 + auVar274 * auVar589 + (auVar671 >> 0x34);
    auVar171 = auVar170 >> 0x34;
    auVar717._8_8_ = 0;
    auVar717._0_8_ = auVar171._0_8_;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = auVar169._8_8_;
    auVar716._8_8_ = auVar171._8_8_;
    auVar716._0_8_ = auVar167._0_8_ & 0xfffffffffffff;
    auVar717 = auVar280 * ZEXT816(0x1000003d10000) + auVar716 + auVar717;
    uVar752 = auVar717._0_8_;
    q.n[0] = 0x3ffffbfffff0bc - (uVar729 & 0xfffffffffffff);
    q.n[1] = 0x3ffffffffffffc - (auVar671._0_8_ & 0xfffffffffffff);
    q.n[2] = 0x3ffffffffffffc - (auVar170._0_8_ & 0xfffffffffffff);
    q.n[3] = 0x3ffffffffffffc - (uVar752 & 0xfffffffffffff);
    q.n[4] = 0x3fffffffffffc -
             ((auVar717._8_8_ << 0xc | uVar752 >> 0x34) + (auVar168._0_8_ & 0xffffffffffff));
    iVar728 = secp256k1_fe_impl_is_square_var(&q);
    if ((iVar728 == 0) ||
       ((secp256k1_fe_sqrt(&r,&q), (c & 1U) != 0 &&
        (iVar728 = secp256k1_fe_impl_normalizes_to_zero_var(&r), iVar728 != 0)))) {
      return 0;
    }
    iVar728 = secp256k1_fe_impl_normalizes_to_zero_var(&s);
    if (iVar728 != 0) {
      return 0;
    }
    secp256k1_fe_impl_inv_var(&local_f0,&s);
    auVar281._8_8_ = 0;
    auVar281._0_8_ = r.n[3];
    auVar594._8_8_ = 0;
    auVar594._0_8_ = local_f0.n[0];
    auVar282._8_8_ = 0;
    auVar282._0_8_ = r.n[2];
    auVar595._8_8_ = 0;
    auVar595._0_8_ = local_f0.n[1];
    auVar283._8_8_ = 0;
    auVar283._0_8_ = r.n[1];
    auVar596._8_8_ = 0;
    auVar596._0_8_ = local_f0.n[2];
    auVar284._8_8_ = 0;
    auVar284._0_8_ = r.n[0];
    auVar597._8_8_ = 0;
    auVar597._0_8_ = local_f0.n[3];
    auVar285._8_8_ = 0;
    auVar285._0_8_ = r.n[4];
    auVar598._8_8_ = 0;
    auVar598._0_8_ = local_f0.n[4];
    auVar286._8_8_ = 0;
    auVar286._0_8_ = SUB168(auVar285 * auVar598,0);
    auVar170 = auVar282 * auVar595 + auVar281 * auVar594 + auVar283 * auVar596 + auVar284 * auVar597
               + auVar286 * ZEXT816(0x1000003d10);
    auVar287._8_8_ = 0;
    auVar287._0_8_ = r.n[4];
    auVar599._8_8_ = 0;
    auVar599._0_8_ = local_f0.n[0];
    auVar288._8_8_ = 0;
    auVar288._0_8_ = r.n[3];
    auVar600._8_8_ = 0;
    auVar600._0_8_ = local_f0.n[1];
    auVar289._8_8_ = 0;
    auVar289._0_8_ = r.n[2];
    auVar601._8_8_ = 0;
    auVar601._0_8_ = local_f0.n[2];
    auVar290._8_8_ = 0;
    auVar290._0_8_ = r.n[1];
    auVar602._8_8_ = 0;
    auVar602._0_8_ = local_f0.n[3];
    auVar291._8_8_ = 0;
    auVar291._0_8_ = r.n[0];
    auVar603._8_8_ = 0;
    auVar603._0_8_ = local_f0.n[4];
    auVar292._8_8_ = 0;
    auVar292._0_8_ = SUB168(auVar285 * auVar598,8);
    auVar167 = auVar292 * ZEXT816(0x1000003d10000) +
               auVar291 * auVar603 + auVar290 * auVar602 + auVar289 * auVar601 + auVar288 * auVar600
               + auVar287 * auVar599 + (auVar170 >> 0x34);
    auVar293._8_8_ = 0;
    auVar293._0_8_ = r.n[0];
    auVar604._8_8_ = 0;
    auVar604._0_8_ = local_f0.n[0];
    auVar294._8_8_ = 0;
    auVar294._0_8_ = r.n[4];
    auVar605._8_8_ = 0;
    auVar605._0_8_ = local_f0.n[1];
    auVar295._8_8_ = 0;
    auVar295._0_8_ = r.n[3];
    auVar606._8_8_ = 0;
    auVar606._0_8_ = local_f0.n[2];
    auVar296._8_8_ = 0;
    auVar296._0_8_ = r.n[2];
    auVar607._8_8_ = 0;
    auVar607._0_8_ = local_f0.n[3];
    auVar297._8_8_ = 0;
    auVar297._0_8_ = r.n[1];
    auVar608._8_8_ = 0;
    auVar608._0_8_ = local_f0.n[4];
    auVar168 = auVar297 * auVar608 + auVar296 * auVar607 + auVar295 * auVar606 + auVar294 * auVar605
               + (auVar167 >> 0x34);
    auVar298._8_8_ = 0;
    auVar298._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
    auVar169 = auVar293 * auVar604 + auVar298 * ZEXT816(0x1000003d1);
    uVar752 = auVar169._0_8_;
    uVar749 = auVar169._8_8_;
    auVar672._8_8_ = uVar749 >> 0x34;
    auVar672._0_8_ = uVar749 * 0x1000 | uVar752 >> 0x34;
    auVar299._8_8_ = 0;
    auVar299._0_8_ = r.n[1];
    auVar609._8_8_ = 0;
    auVar609._0_8_ = local_f0.n[0];
    auVar300._8_8_ = 0;
    auVar300._0_8_ = r.n[0];
    auVar610._8_8_ = 0;
    auVar610._0_8_ = local_f0.n[1];
    auVar301._8_8_ = 0;
    auVar301._0_8_ = r.n[4];
    auVar611._8_8_ = 0;
    auVar611._0_8_ = local_f0.n[2];
    auVar302._8_8_ = 0;
    auVar302._0_8_ = r.n[3];
    auVar612._8_8_ = 0;
    auVar612._0_8_ = local_f0.n[3];
    auVar303._8_8_ = 0;
    auVar303._0_8_ = r.n[2];
    auVar613._8_8_ = 0;
    auVar613._0_8_ = local_f0.n[4];
    auVar168 = auVar301 * auVar611 + auVar303 * auVar613 + auVar302 * auVar612 + (auVar168 >> 0x34);
    auVar304._8_8_ = 0;
    auVar304._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
    auVar672 = auVar304 * ZEXT816(0x1000003d10) + auVar299 * auVar609 + auVar300 * auVar610 +
               auVar672;
    auVar305._8_8_ = 0;
    auVar305._0_8_ = r.n[2];
    auVar614._8_8_ = 0;
    auVar614._0_8_ = local_f0.n[0];
    auVar306._8_8_ = 0;
    auVar306._0_8_ = r.n[1];
    auVar615._8_8_ = 0;
    auVar615._0_8_ = local_f0.n[1];
    auVar307._8_8_ = 0;
    auVar307._0_8_ = r.n[0];
    auVar616._8_8_ = 0;
    auVar616._0_8_ = local_f0.n[2];
    auVar308._8_8_ = 0;
    auVar308._0_8_ = r.n[4];
    auVar617._8_8_ = 0;
    auVar617._0_8_ = local_f0.n[3];
    auVar309._8_8_ = 0;
    auVar309._0_8_ = r.n[3];
    auVar618._8_8_ = 0;
    auVar618._0_8_ = local_f0.n[4];
    auVar168 = auVar309 * auVar618 + auVar308 * auVar617 + (auVar168 >> 0x34);
    auVar310._8_8_ = 0;
    auVar310._0_8_ = auVar168._0_8_;
    auVar169 = auVar310 * ZEXT816(0x1000003d10) +
               auVar307 * auVar616 + auVar306 * auVar615 + auVar305 * auVar614 + (auVar672 >> 0x34);
    auVar171 = auVar169 >> 0x34;
    auVar719._8_8_ = 0;
    auVar719._0_8_ = auVar171._0_8_;
    auVar311._8_8_ = 0;
    auVar311._0_8_ = auVar168._8_8_;
    auVar718._8_8_ = auVar171._8_8_;
    auVar718._0_8_ = auVar170._0_8_ & 0xfffffffffffff;
    auVar719 = auVar311 * ZEXT816(0x1000003d10000) + auVar718 + auVar719;
    uVar749 = auVar719._0_8_;
    lVar731 = (uVar752 & 0xfffffffffffff) + uVar755;
    lVar754 = (auVar672._0_8_ & 0xfffffffffffff) + uVar733;
    lVar741 = (auVar169._0_8_ & 0xfffffffffffff) + uVar747;
    lVar739 = (uVar749 & 0xfffffffffffff) + uVar753;
    uVar752 = -(ulong)((uint)lVar731 & 1);
    uVar745 = uVar752 >> 0xc;
    local_f0.n[4] =
         (uVar752 >> 0x10) + (auVar167._0_8_ & 0xffffffffffff) + uVar750 +
         (auVar719._8_8_ << 0xc | uVar749 >> 0x34);
    iVar728 = (int)uVar745;
    local_f0.n[0] =
         ((ulong)(iVar728 + (int)lVar754 & 1) << 0x33) +
         ((uVar745 & 0xffffefffffc2f) + lVar731 >> 1);
    local_f0.n[1] = ((ulong)((int)lVar741 + iVar728 & 1) << 0x33) + (lVar754 + uVar745 >> 1);
    local_f0.n[2] = ((ulong)((int)lVar739 + iVar728 & 1) << 0x33) + (lVar741 + uVar745 >> 1);
    local_f0.n[3] = ((ulong)((uint)local_f0.n[4] & 1) << 0x33) + (uVar745 + lVar739 >> 1);
    local_f0.n[4] = local_f0.n[4] >> 1;
  }
  secp256k1_fe_sqrt(&local_118,&s);
  if (((c & 5U) == 5) || ((c & 5U) == 0)) {
    local_118.n[0] = 0x3ffffbfffff0bc - local_118.n[0];
    local_118.n[1] = 0x3ffffffffffffc - local_118.n[1];
    local_118.n[2] = 0x3ffffffffffffc - local_118.n[2];
    local_118.n[3] = 0x3ffffffffffffc - local_118.n[3];
    local_118.n[4] = 0x3fffffffffffc - local_118.n[4];
  }
  bVar757 = (c & 1U) == 0;
  uVar752 = 0xf8ef919bb8615;
  if (bVar757) {
    uVar752 = 0x7106e64479ea;
  }
  uVar749 = 0x3cbcb16630fb6;
  if (bVar757) {
    uVar749 = 0xc3434e99cf049;
  }
  uVar745 = 0x8aed0a766a3ec;
  if (bVar757) {
    uVar745 = 0x7512f58995c13;
  }
  uVar744 = 0x693d68e6afa41;
  if (bVar757) {
    uVar744 = 0x96c28719501ef;
  }
  uVar732 = 0x851695d49a83;
  if (bVar757) {
    uVar732 = 0x7ae96a2b657c;
  }
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar752;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = uVar736;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar749;
  auVar620._8_8_ = 0;
  auVar620._0_8_ = uVar742;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar745;
  auVar621._8_8_ = 0;
  auVar621._0_8_ = uVar740;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar744;
  auVar622._8_8_ = 0;
  auVar622._0_8_ = uVar734;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar732;
  auVar623._8_8_ = 0;
  auVar623._0_8_ = uVar746;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = SUB168(auVar316 * auVar623,0);
  auVar169 = auVar313 * auVar620 + auVar312 * auVar619 + auVar314 * auVar621 + auVar315 * auVar622 +
             auVar317 * ZEXT816(0x1000003d10);
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar732;
  auVar624._8_8_ = 0;
  auVar624._0_8_ = uVar736;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar752;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = uVar742;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar749;
  auVar626._8_8_ = 0;
  auVar626._0_8_ = uVar740;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar745;
  auVar627._8_8_ = 0;
  auVar627._0_8_ = uVar734;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar744;
  auVar628._8_8_ = 0;
  auVar628._0_8_ = uVar746;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = SUB168(auVar316 * auVar623,8);
  auVar167 = auVar323 * ZEXT816(0x1000003d10000) +
             auVar322 * auVar628 +
             auVar321 * auVar627 + auVar320 * auVar626 + auVar319 * auVar625 + auVar318 * auVar624 +
             (auVar169 >> 0x34);
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar744;
  auVar629._8_8_ = 0;
  auVar629._0_8_ = uVar736;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar732;
  auVar630._8_8_ = 0;
  auVar630._0_8_ = uVar742;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar752;
  auVar631._8_8_ = 0;
  auVar631._0_8_ = uVar740;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar749;
  auVar632._8_8_ = 0;
  auVar632._0_8_ = uVar734;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar745;
  auVar633._8_8_ = 0;
  auVar633._0_8_ = uVar746;
  auVar168 = auVar328 * auVar633 + auVar326 * auVar631 + auVar325 * auVar630 + auVar327 * auVar632 +
             (auVar167 >> 0x34);
  auVar329._8_8_ = 0;
  auVar329._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
  auVar170 = auVar324 * auVar629 + auVar329 * ZEXT816(0x1000003d1);
  uVar755 = auVar170._0_8_;
  auVar720._8_8_ = 0;
  auVar720._0_8_ = auVar170._8_8_ * 0x1000 | uVar755 >> 0x34;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar745;
  auVar634._8_8_ = 0;
  auVar634._0_8_ = uVar736;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar744;
  auVar635._8_8_ = 0;
  auVar635._0_8_ = uVar742;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar732;
  auVar636._8_8_ = 0;
  auVar636._0_8_ = uVar740;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar752;
  auVar637._8_8_ = 0;
  auVar637._0_8_ = uVar734;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar749;
  auVar638._8_8_ = 0;
  auVar638._0_8_ = uVar746;
  auVar168 = auVar334 * auVar638 + auVar333 * auVar637 + auVar332 * auVar636 + (auVar168 >> 0x34);
  uVar733 = auVar168._0_8_;
  auVar721._8_8_ = 0;
  auVar721._0_8_ = auVar168._8_8_ << 0xc | uVar733 >> 0x34;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar733 & 0xfffffffffffff;
  auVar720 = auVar335 * ZEXT816(0x1000003d10) + auVar331 * auVar635 + auVar330 * auVar634 + auVar720
  ;
  uVar733 = auVar720._0_8_;
  auVar722._8_8_ = 0;
  auVar722._0_8_ = auVar720._8_8_ << 0xc | uVar733 >> 0x34;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar749;
  auVar639._8_8_ = 0;
  auVar639._0_8_ = uVar736;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar745;
  auVar640._8_8_ = 0;
  auVar640._0_8_ = uVar742;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar744;
  auVar641._8_8_ = 0;
  auVar641._0_8_ = uVar740;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar732;
  auVar642._8_8_ = 0;
  auVar642._0_8_ = uVar734;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar752;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = uVar746;
  auVar721 = auVar339 * auVar642 + auVar340 * auVar643 + auVar721;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = auVar721._0_8_;
  auVar722 = auVar341 * ZEXT816(0x1000003d10) +
             auVar338 * auVar641 + auVar337 * auVar640 + auVar336 * auVar639 + auVar722;
  auVar168 = auVar722 >> 0x34;
  auVar724._8_8_ = 0;
  auVar724._0_8_ = auVar168._0_8_;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = auVar721._8_8_;
  auVar723._8_8_ = auVar168._8_8_;
  auVar723._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
  auVar724 = auVar342 * ZEXT816(0x1000003d10000) + auVar723 + auVar724;
  uVar752 = auVar724._0_8_;
  local_f0.n[0] = (uVar755 & 0xfffffffffffff) + local_f0.n[0];
  local_f0.n[1] = (uVar733 & 0xfffffffffffff) + local_f0.n[1];
  local_f0.n[2] = (auVar722._0_8_ & 0xfffffffffffff) + local_f0.n[2];
  local_f0.n[3] = (uVar752 & 0xfffffffffffff) + local_f0.n[3];
  local_f0.n[4] =
       (auVar724._8_8_ << 0xc | uVar752 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff) + local_f0.n[4]
  ;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = local_118.n[0];
  auVar644._8_8_ = 0;
  auVar644._0_8_ = local_f0.n[3];
  auVar344._8_8_ = 0;
  auVar344._0_8_ = local_118.n[1];
  auVar645._8_8_ = 0;
  auVar645._0_8_ = local_f0.n[2];
  auVar345._8_8_ = 0;
  auVar345._0_8_ = local_118.n[2];
  auVar646._8_8_ = 0;
  auVar646._0_8_ = local_f0.n[1];
  auVar346._8_8_ = 0;
  auVar346._0_8_ = local_118.n[3];
  auVar647._8_8_ = 0;
  auVar647._0_8_ = local_f0.n[0];
  auVar347._8_8_ = 0;
  auVar347._0_8_ = local_118.n[4];
  auVar648._8_8_ = 0;
  auVar648._0_8_ = local_f0.n[4];
  auVar348._8_8_ = 0;
  auVar348._0_8_ = SUB168(auVar347 * auVar648,0);
  auVar169 = auVar344 * auVar645 + auVar343 * auVar644 + auVar345 * auVar646 + auVar346 * auVar647 +
             auVar348 * ZEXT816(0x1000003d10);
  auVar349._8_8_ = 0;
  auVar349._0_8_ = local_f0.n[4];
  auVar649._8_8_ = 0;
  auVar649._0_8_ = local_118.n[0];
  auVar350._8_8_ = 0;
  auVar350._0_8_ = local_118.n[1];
  auVar650._8_8_ = 0;
  auVar650._0_8_ = local_f0.n[3];
  auVar351._8_8_ = 0;
  auVar351._0_8_ = local_118.n[2];
  auVar651._8_8_ = 0;
  auVar651._0_8_ = local_f0.n[2];
  auVar352._8_8_ = 0;
  auVar352._0_8_ = local_118.n[3];
  auVar652._8_8_ = 0;
  auVar652._0_8_ = local_f0.n[1];
  auVar353._8_8_ = 0;
  auVar353._0_8_ = local_118.n[4];
  auVar653._8_8_ = 0;
  auVar653._0_8_ = local_f0.n[0];
  auVar354._8_8_ = 0;
  auVar354._0_8_ = SUB168(auVar347 * auVar648,8);
  auVar167 = auVar354 * ZEXT816(0x1000003d10000) +
             auVar353 * auVar653 +
             auVar352 * auVar652 + auVar351 * auVar651 + auVar350 * auVar650 + auVar349 * auVar649 +
             (auVar169 >> 0x34);
  auVar355._8_8_ = 0;
  auVar355._0_8_ = local_118.n[0];
  auVar654._8_8_ = 0;
  auVar654._0_8_ = local_f0.n[0];
  auVar356._8_8_ = 0;
  auVar356._0_8_ = local_118.n[1];
  auVar655._8_8_ = 0;
  auVar655._0_8_ = local_f0.n[4];
  auVar357._8_8_ = 0;
  auVar357._0_8_ = local_118.n[2];
  auVar656._8_8_ = 0;
  auVar656._0_8_ = local_f0.n[3];
  auVar358._8_8_ = 0;
  auVar358._0_8_ = local_118.n[3];
  auVar657._8_8_ = 0;
  auVar657._0_8_ = local_f0.n[2];
  auVar359._8_8_ = 0;
  auVar359._0_8_ = local_118.n[4];
  auVar658._8_8_ = 0;
  auVar658._0_8_ = local_f0.n[1];
  auVar168 = auVar359 * auVar658 + auVar358 * auVar657 + auVar357 * auVar656 + auVar356 * auVar655 +
             (auVar167 >> 0x34);
  auVar360._8_8_ = 0;
  auVar360._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
  auVar170 = auVar360 * ZEXT816(0x1000003d1) + auVar355 * auVar654;
  uVar752 = auVar170._0_8_;
  uVar749 = auVar170._8_8_;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = local_118.n[0];
  auVar659._8_8_ = 0;
  auVar659._0_8_ = local_f0.n[1];
  auVar362._8_8_ = 0;
  auVar362._0_8_ = local_118.n[1];
  auVar660._8_8_ = 0;
  auVar660._0_8_ = local_f0.n[0];
  auVar673._8_8_ = uVar749 >> 0x34;
  auVar673._0_8_ = uVar749 * 0x1000 | uVar752 >> 0x34;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = local_118.n[2];
  auVar661._8_8_ = 0;
  auVar661._0_8_ = local_f0.n[4];
  auVar364._8_8_ = 0;
  auVar364._0_8_ = local_118.n[3];
  auVar662._8_8_ = 0;
  auVar662._0_8_ = local_f0.n[3];
  auVar365._8_8_ = 0;
  auVar365._0_8_ = local_118.n[4];
  auVar663._8_8_ = 0;
  auVar663._0_8_ = local_f0.n[2];
  auVar168 = (auVar168 >> 0x34) + auVar365 * auVar663 + auVar364 * auVar662 + auVar363 * auVar661;
  uVar749 = auVar168._0_8_;
  uVar745 = auVar168._8_8_;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar749 & 0xfffffffffffff;
  auVar673 = auVar366 * ZEXT816(0x1000003d10) + auVar362 * auVar660 + auVar361 * auVar659 + auVar673
  ;
  auVar674._8_8_ = uVar745 >> 0x34;
  auVar674._0_8_ = uVar745 * 0x1000 | uVar749 >> 0x34;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = local_118.n[0];
  auVar664._8_8_ = 0;
  auVar664._0_8_ = local_f0.n[2];
  auVar368._8_8_ = 0;
  auVar368._0_8_ = local_118.n[1];
  auVar665._8_8_ = 0;
  auVar665._0_8_ = local_f0.n[1];
  auVar369._8_8_ = 0;
  auVar369._0_8_ = local_118.n[2];
  auVar666._8_8_ = 0;
  auVar666._0_8_ = local_f0.n[0];
  auVar370._8_8_ = 0;
  auVar370._0_8_ = local_118.n[3];
  auVar667._8_8_ = 0;
  auVar667._0_8_ = local_f0.n[4];
  auVar371._8_8_ = 0;
  auVar371._0_8_ = local_118.n[4];
  auVar668._8_8_ = 0;
  auVar668._0_8_ = local_f0.n[3];
  auVar674 = auVar371 * auVar668 + auVar370 * auVar667 + auVar674;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = auVar674._0_8_;
  auVar168 = auVar372 * ZEXT816(0x1000003d10) +
             auVar369 * auVar666 + auVar368 * auVar665 + auVar367 * auVar664 + (auVar673 >> 0x34);
  t->n[0] = uVar752 & 0xfffffffffffff;
  auVar170 = auVar168 >> 0x34;
  auVar726._8_8_ = 0;
  auVar726._0_8_ = auVar170._0_8_;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = auVar674._8_8_;
  auVar725._8_8_ = auVar170._8_8_;
  auVar725._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
  t->n[1] = auVar673._0_8_ & 0xfffffffffffff;
  auVar726 = auVar373 * ZEXT816(0x1000003d10000) + auVar725 + auVar726;
  uVar752 = auVar726._0_8_;
  t->n[2] = auVar168._0_8_ & 0xfffffffffffff;
  t->n[3] = uVar752 & 0xfffffffffffff;
  t->n[4] = (auVar726._8_8_ << 0xc | uVar752 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
  return 1;
}

Assistant:

static int secp256k1_ellswift_xswiftec_inv_var(secp256k1_fe *t, const secp256k1_fe *x_in, const secp256k1_fe *u_in, int c) {
    /* The implemented algorithm is this (all arithmetic, except involving c, is mod p):
     *
     * - If (c & 2) = 0:
     *   - If (-x-u) is a valid X coordinate, fail.
     *   - Let s=-(u^3+7)/(u^2+u*x+x^2).
     *   - If s is not square, fail.
     *   - Let v=x.
     * - If (c & 2) = 2:
     *   - Let s=x-u.
     *   - If s is not square, fail.
     *   - Let r=sqrt(-s*(4*(u^3+7)+3*u^2*s)); fail if it doesn't exist.
     *   - If (c & 1) = 1 and r = 0, fail.
     *   - If s=0, fail.
     *   - Let v=(r/s-u)/2.
     * - Let w=sqrt(s).
     * - If (c & 5) = 0: return -w*(c3*u + v).
     * - If (c & 5) = 1: return  w*(c4*u + v).
     * - If (c & 5) = 4: return  w*(c3*u + v).
     * - If (c & 5) = 5: return -w*(c4*u + v).
     */
    secp256k1_fe x = *x_in, u = *u_in, g, v, s, m, r, q;
    int ret;

    secp256k1_fe_normalize_weak(&x);
    secp256k1_fe_normalize_weak(&u);

    VERIFY_CHECK(c >= 0 && c < 8);
    VERIFY_CHECK(secp256k1_ge_x_on_curve_var(&x));

    if (!(c & 2)) {
        /* c is in {0, 1, 4, 5}. In this case we look for an inverse under the x1 (if c=0 or
         * c=4) formula, or x2 (if c=1 or c=5) formula. */

        /* If -u-x is a valid X coordinate, fail. This would yield an encoding that roundtrips
         * back under the x3 formula instead (which has priority over x1 and x2, so the decoding
         * would not match x). */
        m = x;                                          /* m = x */
        secp256k1_fe_add(&m, &u);                       /* m = u+x */
        secp256k1_fe_negate(&m, &m, 2);                 /* m = -u-x */
        /* Test if (-u-x) is a valid X coordinate. If so, fail. */
        if (secp256k1_ge_x_on_curve_var(&m)) return 0;

        /* Let s = -(u^3 + 7)/(u^2 + u*x + x^2) [first part] */
        secp256k1_fe_sqr(&s, &m);                       /* s = (u+x)^2 */
        secp256k1_fe_negate(&s, &s, 1);                 /* s = -(u+x)^2 */
        secp256k1_fe_mul(&m, &u, &x);                   /* m = u*x */
        secp256k1_fe_add(&s, &m);                       /* s = -(u^2 + u*x + x^2) */

        /* Note that at this point, s = 0 is impossible. If it were the case:
         *             s = -(u^2 + u*x + x^2) = 0
         * =>                 u^2 + u*x + x^2 = 0
         * =>   (u + 2*x) * (u^2 + u*x + x^2) = 0
         * => 2*x^3 + 3*x^2*u + 3*x*u^2 + u^3 = 0
         * =>                 (x + u)^3 + x^3 = 0
         * =>                             x^3 = -(x + u)^3
         * =>                         x^3 + B = (-u - x)^3 + B
         *
         * However, we know x^3 + B is square (because x is on the curve) and
         * that (-u-x)^3 + B is not square (the secp256k1_ge_x_on_curve_var(&m)
         * test above would have failed). This is a contradiction, and thus the
         * assumption s=0 is false. */
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(&s));

        /* If s is not square, fail. We have not fully computed s yet, but s is square iff
         * -(u^3+7)*(u^2+u*x+x^2) is square (because a/b is square iff a*b is square and b is
         * nonzero). */
        secp256k1_fe_sqr(&g, &u);                       /* g = u^2 */
        secp256k1_fe_mul(&g, &g, &u);                   /* g = u^3 */
        secp256k1_fe_add_int(&g, SECP256K1_B);          /* g = u^3+7 */
        secp256k1_fe_mul(&m, &s, &g);                   /* m = -(u^3 + 7)*(u^2 + u*x + x^2) */
        if (!secp256k1_fe_is_square_var(&m)) return 0;

        /* Let s = -(u^3 + 7)/(u^2 + u*x + x^2) [second part] */
        secp256k1_fe_inv_var(&s, &s);                   /* s = -1/(u^2 + u*x + x^2) [no div by 0] */
        secp256k1_fe_mul(&s, &s, &g);                   /* s = -(u^3 + 7)/(u^2 + u*x + x^2) */

        /* Let v = x. */
        v = x;
    } else {
        /* c is in {2, 3, 6, 7}. In this case we look for an inverse under the x3 formula. */

        /* Let s = x-u. */
        secp256k1_fe_negate(&m, &u, 1);                 /* m = -u */
        s = m;                                          /* s = -u */
        secp256k1_fe_add(&s, &x);                       /* s = x-u */

        /* If s is not square, fail. */
        if (!secp256k1_fe_is_square_var(&s)) return 0;

        /* Let r = sqrt(-s*(4*(u^3+7)+3*u^2*s)); fail if it doesn't exist. */
        secp256k1_fe_sqr(&g, &u);                       /* g = u^2 */
        secp256k1_fe_mul(&q, &s, &g);                   /* q = s*u^2 */
        secp256k1_fe_mul_int(&q, 3);                    /* q = 3*s*u^2 */
        secp256k1_fe_mul(&g, &g, &u);                   /* g = u^3 */
        secp256k1_fe_mul_int(&g, 4);                    /* g = 4*u^3 */
        secp256k1_fe_add_int(&g, 4 * SECP256K1_B);      /* g = 4*(u^3+7) */
        secp256k1_fe_add(&q, &g);                       /* q = 4*(u^3+7)+3*s*u^2 */
        secp256k1_fe_mul(&q, &q, &s);                   /* q = s*(4*(u^3+7)+3*u^2*s) */
        secp256k1_fe_negate(&q, &q, 1);                 /* q = -s*(4*(u^3+7)+3*u^2*s) */
        if (!secp256k1_fe_is_square_var(&q)) return 0;
        ret = secp256k1_fe_sqrt(&r, &q);                /* r = sqrt(-s*(4*(u^3+7)+3*u^2*s)) */
#ifdef VERIFY
        VERIFY_CHECK(ret);
#else
        (void)ret;
#endif

        /* If (c & 1) = 1 and r = 0, fail. */
        if (EXPECT((c & 1) && secp256k1_fe_normalizes_to_zero_var(&r), 0)) return 0;

        /* If s = 0, fail. */
        if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&s), 0)) return 0;

        /* Let v = (r/s-u)/2. */
        secp256k1_fe_inv_var(&v, &s);                   /* v = 1/s [no div by 0] */
        secp256k1_fe_mul(&v, &v, &r);                   /* v = r/s */
        secp256k1_fe_add(&v, &m);                       /* v = r/s-u */
        secp256k1_fe_half(&v);                          /* v = (r/s-u)/2 */
    }

    /* Let w = sqrt(s). */
    ret = secp256k1_fe_sqrt(&m, &s);                    /* m = sqrt(s) = w */
    VERIFY_CHECK(ret);

    /* Return logic. */
    if ((c & 5) == 0 || (c & 5) == 5) {
        secp256k1_fe_negate(&m, &m, 1);                 /* m = -w */
    }
    /* Now m = {-w if c&5=0 or c&5=5; w otherwise}. */
    secp256k1_fe_mul(&u, &u, c&1 ? &secp256k1_ellswift_c4 : &secp256k1_ellswift_c3);
    /* u = {c4 if c&1=1; c3 otherwise}*u */
    secp256k1_fe_add(&u, &v);                           /* u = {c4 if c&1=1; c3 otherwise}*u + v */
    secp256k1_fe_mul(t, &m, &u);
    return 1;
}